

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

MatchProperties __thiscall cmFileCopier::CollectMatchProperties(cmFileCopier *this,char *file)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  pointer pMVar5;
  pointer this_00;
  allocator local_51;
  string local_50;
  
  this_00 = (this->MatchRules).
            super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar4 = 0;
  if (this_00 ==
      (this->MatchRules).
      super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = 0;
LAB_002ff646:
    if (this->MatchlessFiles == false) {
      std::__cxx11::string::string((string *)&local_50,file,&local_51);
      bVar2 = cmsys::SystemTools::FileIsDirectory(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar3 = !bVar2;
    }
  }
  else {
    bVar2 = false;
    bVar3 = 0;
    do {
      while( true ) {
        pMVar5 = this_00 + 1;
        bVar1 = cmsys::RegularExpression::find(&this_00->Regex,file);
        if (bVar1) break;
        this_00 = pMVar5;
        if (pMVar5 == (this->MatchRules).
                      super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          uVar4 = uVar4 << 0x20;
          if (bVar2) goto LAB_002ff68a;
          goto LAB_002ff646;
        }
      }
      bVar3 = bVar3 | (this_00->Properties).Exclude;
      uVar4 = (ulong)((uint)uVar4 | (this_00->Properties).Permissions);
      bVar2 = true;
      this_00 = pMVar5;
    } while (pMVar5 != (this->MatchRules).
                       super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    uVar4 = uVar4 << 0x20;
  }
LAB_002ff68a:
  return (MatchProperties)(bVar3 | uVar4);
}

Assistant:

MatchProperties CollectMatchProperties(const char* file)
  {
// Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
    std::string lower = cmSystemTools::LowerCase(file);
    const char* file_to_match = lower.c_str();
#else
    const char* file_to_match = file;
#endif

    // Collect properties from all matching rules.
    bool matched = false;
    MatchProperties result;
    for (std::vector<MatchRule>::iterator mr = this->MatchRules.begin();
         mr != this->MatchRules.end(); ++mr) {
      if (mr->Regex.find(file_to_match)) {
        matched = true;
        result.Exclude |= mr->Properties.Exclude;
        result.Permissions |= mr->Properties.Permissions;
      }
    }
    if (!matched && !this->MatchlessFiles) {
      result.Exclude = !cmSystemTools::FileIsDirectory(file);
    }
    return result;
  }